

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pgraph_class_celsius.cc
# Opt level: O1

void __thiscall hwtest::pgraph::MthdCelsiusStencilOp::emulate_mthd(MthdCelsiusStencilOp *this)

{
  pgraph_state *state;
  uint32_t uVar1;
  byte bVar2;
  uint val;
  long lVar3;
  uint32_t err;
  
  state = &(this->super_SingleMthdTest).super_MthdTest.super_StateTest.exp;
  pgraph_celsius_pre_icmd(state);
  err = (this->super_SingleMthdTest).super_MthdTest.super_StateTest.exp.celsius_config_c >> 6 & 4;
  uVar1 = (this->super_SingleMthdTest).super_MthdTest.val;
  if ((int)uVar1 < 0x1e00) {
    if (uVar1 == 0) {
      lVar3 = 2;
      goto LAB_0020aedc;
    }
    if (uVar1 == 0x150a) {
      lVar3 = 6;
      goto LAB_0020aedc;
    }
LAB_0020aeb4:
    err = err | 1;
    lVar3 = 0;
  }
  else {
    switch(uVar1) {
    case 0x1e00:
      lVar3 = 1;
      break;
    case 0x1e01:
      lVar3 = 3;
      break;
    case 0x1e02:
      lVar3 = 4;
      break;
    case 0x1e03:
      lVar3 = 5;
      break;
    default:
      if (uVar1 == 0x8507) {
        lVar3 = 7;
        break;
      }
      if (uVar1 == 0x8508) {
        lVar3 = 8;
        break;
      }
      goto LAB_0020aeb4;
    }
  }
LAB_0020aedc:
  if (err != 0) {
    MthdTest::warn((MthdTest *)this,err);
    return;
  }
  if (((this->super_SingleMthdTest).super_MthdTest.super_StateTest.exp.nsource & 2) != 0) {
    return;
  }
  bVar2 = (char)this->which << 2;
  val = (uint)(lVar3 << (bVar2 & 0x3f)) |
        ~(uint)(0xfL << (bVar2 & 0x3f)) &
        (this->super_SingleMthdTest).super_MthdTest.super_StateTest.exp.bundle_stencil_b;
  (this->super_SingleMthdTest).super_MthdTest.super_StateTest.exp.bundle_stencil_b = val;
  pgraph_celsius_icmd(state,0x1e,val,true);
  return;
}

Assistant:

void emulate_mthd() override {
		pgraph_celsius_pre_icmd(&exp);
		uint32_t err = 0;
		if (extr(exp.celsius_config_c, 8, 1))
			err |= 4;
		uint32_t rv = 0;
		switch (val) {
			case 0:
				rv = 2;
				break;
			case 0x150a:
				rv = 6;
				break;
			case 0x1e00:
				rv = 1;
				break;
			case 0x1e01:
				rv = 3;
				break;
			case 0x1e02:
				rv = 4;
				break;
			case 0x1e03:
				rv = 5;
				break;
			case 0x8507:
				rv = 7;
				break;
			case 0x8508:
				rv = 8;
				break;
			default:
				err |= 1;
		}
		if (err) {
			warn(err);
		} else {
			if (!extr(exp.nsource, 1, 1)) {
				insrt(exp.bundle_stencil_b, 4 * which, 4, rv);
				pgraph_celsius_icmd(&exp, 0x1e, exp.bundle_stencil_b, true);
			}
		}
	}